

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O1

void GenCodeCmdGequall(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEAX,sQWORD,rEBX,(uint)((ulong)cmd >> 0xd) & 0x7f8);
  GenCodeLoadInt64FromPointer(ctx,rEDX,rEDX,cmd.rC,cmd.argument);
  CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
            (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
  EMIT_OP_REG_REG(&ctx->ctx,o_xor,rECX,rECX);
  EMIT_OP_REG_REG(&ctx->ctx,o_cmp64,rEAX,rEDX);
  EMIT_OP_REG(&ctx->ctx,o_setge,rECX);
  EMIT_OP_RPTR_REG(&ctx->ctx,o_mov,sDWORD,rEBX,(uint)((ulong)cmd >> 5) & 0x7f8,rECX);
  return;
}

Assistant:

void GenCodeCmdGequall(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
#if defined(_M_X64)
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRAX, sQWORD, rREG, cmd.rB * 8); // Load long lhs value

	GenCodeLoadInt64FromPointer(ctx, rRDX, rRDX, cmd.rC, cmd.argument);

	ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

	EMIT_OP_REG_REG(ctx.ctx, o_xor, rECX, rECX);
	EMIT_OP_REG_REG(ctx.ctx, o_cmp64, rRAX, rRDX);
	EMIT_OP_REG(ctx.ctx, o_setge, rECX);

	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8, rECX); // Store long to target
#else
	// Load long RHS value into EAX:EDX
	x86GenCodeLoadInt64FromPointer(ctx, rEDI, rEDX, rEDI, cmd.rC, cmd.argument);

	// Load long LHS value into ECX:EDI
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rB * 8);
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rECX, sDWORD, rREG, cmd.rB * 8 + 4);

	EMIT_OP_REG_REG(ctx.ctx, o_cmp, rEAX, rEDX);
	EMIT_OP_REG_REG(ctx.ctx, o_sbb, rECX, rEDI);
	EMIT_REG_READ(ctx.ctx, rECX); // setcc implicitly reads the result of the last value-producing instruction
	EMIT_OP_REG(ctx.ctx, o_setge, rEAX);

	EMIT_OP_REG_NUM(ctx.ctx, o_and, rEAX, 1);
	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8, rEAX); // Store int to target
#endif
}